

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O3

int Aig_CutFilter(Aig_ManCut_t *p,Aig_Obj_t *pObj,Aig_Cut_t *pCut)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Aig_Cut_t *pAVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int k;
  ulong uVar9;
  
  iVar3 = p->nCutsMax;
  if (0 < iVar3) {
    pAVar4 = p->pCuts[pObj->Id];
    iVar5 = 0;
    do {
      bVar1 = pAVar4->nFanins;
      if (pAVar4 != pCut && '\x01' < (char)bVar1) {
        bVar2 = pCut->nFanins;
        uVar6 = (ulong)bVar2;
        uVar8 = pCut->uSign & pAVar4->uSign;
        if ((char)bVar2 < (char)bVar1) {
          if (uVar8 == pCut->uSign) {
            if ('\0' < (char)bVar2) {
              uVar7 = 0;
              do {
                uVar9 = 0;
                while (*(int *)((long)&pCut[1].pNext + uVar7 * 4) !=
                       *(int *)((long)&pAVar4[1].pNext + uVar9 * 4)) {
                  uVar9 = uVar9 + 1;
                  if (bVar1 == uVar9) goto LAB_006b74f4;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 != uVar6);
            }
            pAVar4->nFanins = '\0';
          }
        }
        else if (uVar8 == pAVar4->uSign) {
          uVar7 = 0;
          while( true ) {
            uVar9 = 0;
            while (*(int *)((long)&pAVar4[1].pNext + uVar7 * 4) !=
                   *(int *)((long)&pCut[1].pNext + uVar9 * 4)) {
              uVar9 = uVar9 + 1;
              if (uVar6 == uVar9) goto LAB_006b74f4;
            }
            if (uVar6 == uVar9) break;
            uVar7 = uVar7 + 1;
            if (uVar7 == bVar1) {
              pCut->nFanins = '\0';
              return 1;
            }
          }
        }
      }
LAB_006b74f4:
      iVar5 = iVar5 + 1;
      pAVar4 = (Aig_Cut_t *)((long)&pAVar4->pNext + (long)pAVar4->nCutSize);
    } while (iVar5 != iVar3);
  }
  return 0;
}

Assistant:

int Aig_CutFilter( Aig_ManCut_t * p, Aig_Obj_t * pObj, Aig_Cut_t * pCut )
{ 
    Aig_Cut_t * pTemp;
    int i;
    // go through the cuts of the node
    Aig_ObjForEachCut( p, pObj, pTemp, i )
    {
        if ( pTemp->nFanins < 2 )
            continue;
        if ( pTemp == pCut )
            continue;
        if ( pTemp->nFanins > pCut->nFanins )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( Aig_CutCheckDominance( pCut, pTemp ) )
            {
                // remove contained cut
                pTemp->nFanins = 0;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Aig_CutCheckDominance( pTemp, pCut ) )
            {
                // remove the given
                pCut->nFanins = 0;
                return 1;
            }
        }
    }
    return 0;
}